

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelinePushConstantTests.cpp
# Opt level: O0

vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> * __thiscall
vkt::pipeline::anon_unknown_1::PushConstantGraphicsTestInstance::createQuad
          (vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
           *__return_storage_ptr__,PushConstantGraphicsTestInstance *this,float size)

{
  undefined1 local_bc [8];
  Vertex4RGBA UpperRightVertex;
  Vertex4RGBA UpperLeftVertex;
  Vertex4RGBA lowerRightVertex;
  Vertex4RGBA lowerLeftVertex;
  undefined1 local_30 [8];
  Vec4 color;
  float size_local;
  PushConstantGraphicsTestInstance *this_local;
  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *vertices;
  
  color.m_data[2]._3_1_ = 0;
  color.m_data[3] = size;
  std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::vector
            (__return_storage_ptr__);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_30,1.0,0.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(lowerRightVertex.color.m_data + 2),-color.m_data[3],
             -color.m_data[3],0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(lowerLeftVertex.position.m_data + 2),(Vector<float,_4> *)local_30)
  ;
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(UpperLeftVertex.color.m_data + 2),color.m_data[3],-color.m_data[3]
             ,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(lowerRightVertex.position.m_data + 2),(Vector<float,_4> *)local_30
            );
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(UpperRightVertex.color.m_data + 2),-color.m_data[3],
             color.m_data[3],0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(UpperLeftVertex.position.m_data + 2),(Vector<float,_4> *)local_30)
  ;
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)local_bc,color.m_data[3],color.m_data[3],0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(UpperRightVertex.position.m_data + 2),(Vector<float,_4> *)local_30
            );
  std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::push_back
            (__return_storage_ptr__,(value_type *)(lowerRightVertex.color.m_data + 2));
  std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::push_back
            (__return_storage_ptr__,(value_type *)(UpperLeftVertex.color.m_data + 2));
  std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::push_back
            (__return_storage_ptr__,(value_type *)(UpperRightVertex.color.m_data + 2));
  std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::push_back
            (__return_storage_ptr__,(value_type *)(UpperRightVertex.color.m_data + 2));
  std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::push_back
            (__return_storage_ptr__,(value_type *)(UpperLeftVertex.color.m_data + 2));
  std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::push_back
            (__return_storage_ptr__,(value_type *)local_bc);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Vertex4RGBA> PushConstantGraphicsTestInstance::createQuad(const float size)
{
	std::vector<Vertex4RGBA>	vertices;

	const tcu::Vec4				color				= tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f);
	const Vertex4RGBA			lowerLeftVertex		= {tcu::Vec4(-size, -size, 0.0f, 1.0f), color};
	const Vertex4RGBA			lowerRightVertex	= {tcu::Vec4(size, -size, 0.0f, 1.0f), color};
	const Vertex4RGBA			UpperLeftVertex		= {tcu::Vec4(-size, size, 0.0f, 1.0f), color};
	const Vertex4RGBA			UpperRightVertex	= {tcu::Vec4(size, size, 0.0f, 1.0f), color};

	vertices.push_back(lowerLeftVertex);
	vertices.push_back(lowerRightVertex);
	vertices.push_back(UpperLeftVertex);
	vertices.push_back(UpperLeftVertex);
	vertices.push_back(lowerRightVertex);
	vertices.push_back(UpperRightVertex);

	return vertices;
}